

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryHelpers.cpp
# Opt level: O1

string * __thiscall
helics::generateInterfaceQueryResults
          (string *__return_storage_ptr__,helics *this,string_view request,HandleManager *handles,
          GlobalFederateId fed,
          function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
          *addHeaderInfo)

{
  value_t vVar1;
  json_value jVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  ulong uVar7;
  HandleManager *hm;
  void *__s1;
  _Elt_pointer pBVar8;
  undefined4 in_register_0000008c;
  long lVar9;
  size_type __rlen;
  BasicHandleInfo *ele;
  _Map_pointer ppBVar10;
  _Elt_pointer pBVar11;
  BasicHandleInfo *handle;
  _Elt_pointer pBVar12;
  json jVar13;
  string *ret;
  json base;
  json V;
  string_t local_f0;
  GlobalFederateId local_cc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  _Elt_pointer local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  data local_90;
  data local_80;
  data local_70;
  data local_60;
  data local_50;
  data local_40;
  
  lVar9 = CONCAT44(in_register_0000008c,fed.gid);
  hm = (HandleManager *)request._M_str;
  __s1 = (void *)request._M_len;
  iVar5 = (int)handles;
  if ((helics *)0xd < this + -6) goto switchD_0037f97d_caseD_8;
  local_cc.gid = iVar5;
  switch(this) {
  case (helics *)0x6:
    iVar4 = bcmp(__s1,"inputs",(size_t)this);
    if (iVar4 == 0) {
      local_98 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_98;
      *(undefined2 *)&__return_storage_ptr__->field_2 = 0x5b;
      __return_storage_ptr__->_M_string_length = 1;
      pBVar11 = (hm->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_a0 = (hm->handles).
                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pBVar11 != local_a0) {
        pBVar12 = (hm->handles).
                  super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
        local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(hm->handles).
                      super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node;
        do {
          if ((((iVar5 == -2010000000) || (iVar5 == -1700000000)) ||
              ((pBVar11->handle).fed_id.gid == iVar5)) &&
             (((pBVar11->handleType == TRANSLATOR || (pBVar11->handleType == INPUT)) &&
              ((pBVar11->key)._M_string_length != 0)))) {
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            pcVar3 = (pBVar11->key)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c0,pcVar3,pcVar3 + (pBVar11->key)._M_string_length);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_90,&local_c0);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::dump(&local_f0,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_90,-1,' ',true,hex);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_90);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,
                      (char *)CONCAT71(local_f0._M_dataplus._M_p._1_7_,
                                       local_f0._M_dataplus._M_p._0_1_),local_f0._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_f0._M_dataplus._M_p._1_7_,local_f0._M_dataplus._M_p._0_1_) !=
                &local_f0.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_f0._M_dataplus._M_p._1_7_,
                                       local_f0._M_dataplus._M_p._0_1_),
                              local_f0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,',');
          }
          pBVar11 = pBVar11 + 1;
          if (pBVar11 == pBVar12) {
            pBVar11 = *(_Map_pointer)((long)local_c8 + 8);
            local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)((long)local_c8 + 8);
            pBVar12 = pBVar11 + 3;
          }
        } while (pBVar11 != local_a0);
      }
      uVar7 = __return_storage_ptr__->_M_string_length;
      if (uVar7 < 2) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,']');
        return __return_storage_ptr__;
      }
      goto LAB_003805ed;
    }
    switch(this) {
    case (helics *)0x7:
      goto switchD_0037f97d_caseD_7;
    default:
      goto switchD_0037f97d_caseD_8;
    case (helics *)0x9:
      goto switchD_0037f97d_caseD_9;
    case (helics *)0xb:
      goto switchD_0037f97d_caseD_b;
    case (helics *)0xc:
      goto switchD_0037f97d_caseD_c;
    case (helics *)0xd:
      goto switchD_0037f97d_caseD_d;
    case (helics *)0xe:
      goto switchD_0037f97d_caseD_e;
    case (helics *)0x10:
      goto switchD_0037f97d_caseD_10;
    case (helics *)0x11:
      break;
    case (helics *)0x12:
      goto switchD_0037f97d_caseD_12;
    case (helics *)0x13:
      goto switchD_0037f97d_caseD_13;
    }
  case (helics *)0x7:
switchD_0037f97d_caseD_7:
    iVar4 = bcmp(__s1,"filters",(size_t)this);
    if (iVar4 == 0) {
      local_c8 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_c8;
      *(undefined2 *)&__return_storage_ptr__->field_2 = 0x5b;
      __return_storage_ptr__->_M_string_length = 1;
      pBVar11 = (hm->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_a0 = (hm->handles).
                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pBVar11 != local_a0) {
        pBVar12 = (hm->handles).
                  super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppBVar10 = (hm->handles).
                   super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        do {
          if ((((iVar5 == -2010000000) || (iVar5 == -1700000000)) ||
              ((pBVar11->handle).fed_id.gid == iVar5)) &&
             ((pBVar11->handleType == FILTER && ((pBVar11->key)._M_string_length != 0)))) {
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            pcVar3 = (pBVar11->key)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c0,pcVar3,pcVar3 + (pBVar11->key)._M_string_length);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_90,&local_c0);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::dump(&local_f0,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_90,-1,' ',true,hex);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_90);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,
                      (char *)CONCAT71(local_f0._M_dataplus._M_p._1_7_,
                                       local_f0._M_dataplus._M_p._0_1_),local_f0._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_f0._M_dataplus._M_p._1_7_,local_f0._M_dataplus._M_p._0_1_) !=
                &local_f0.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_f0._M_dataplus._M_p._1_7_,
                                       local_f0._M_dataplus._M_p._0_1_),
                              local_f0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,',');
          }
          pBVar11 = pBVar11 + 1;
          if (pBVar11 == pBVar12) {
            pBVar11 = ppBVar10[1];
            ppBVar10 = ppBVar10 + 1;
            pBVar12 = pBVar11 + 3;
          }
        } while (pBVar11 != local_a0);
      }
      uVar7 = __return_storage_ptr__->_M_string_length;
      if (uVar7 < 2) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,']');
        return __return_storage_ptr__;
      }
LAB_003805ed:
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar7 - 1] = ']';
      return __return_storage_ptr__;
    }
    switch(this) {
    case (helics *)0x9:
      goto switchD_0037f97d_caseD_9;
    default:
      goto switchD_0037f97d_caseD_8;
    case (helics *)0xb:
      goto switchD_0037f97d_caseD_b;
    case (helics *)0xe:
      goto switchD_0037f97d_caseD_e;
    case (helics *)0x10:
      goto switchD_0037f97d_caseD_10;
    case (helics *)0x11:
      break;
    case (helics *)0x12:
      goto switchD_0037f97d_caseD_12;
    }
  default:
    goto switchD_0037f97d_caseD_8;
  case (helics *)0x9:
switchD_0037f97d_caseD_9:
    iVar5 = bcmp(__s1,"endpoints",(size_t)this);
    if (iVar5 == 0) {
      generateStringVector_if_abi_cxx11_<helics::HandleManager,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::HandleManager_const&,helics::GlobalFederateId,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__8,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::HandleManager_const&,helics::GlobalFederateId,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__9>
                (__return_storage_ptr__,hm,(ulong)handles & 0xffffffff);
      return __return_storage_ptr__;
    }
    if (this != (helics *)0x11) {
      if (this != (helics *)&DAT_00000010) goto switchD_0037f97d_caseD_8;
      goto switchD_0037f97d_caseD_10;
    }
    break;
  case (helics *)0xb:
switchD_0037f97d_caseD_b:
    iVar5 = bcmp(__s1,"translators",(size_t)this);
    if (iVar5 == 0) {
      generateStringVector_if_abi_cxx11_<helics::HandleManager,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::HandleManager_const&,helics::GlobalFederateId,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__6,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::HandleManager_const&,helics::GlobalFederateId,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__7>
                (__return_storage_ptr__,hm,(ulong)handles & 0xffffffff);
      return __return_storage_ptr__;
    }
    switch(this) {
    case (helics *)0x9:
      goto switchD_0037f97d_caseD_9;
    default:
      goto switchD_0037f97d_caseD_8;
    case (helics *)0x10:
      goto switchD_0037f97d_caseD_10;
    case (helics *)0x11:
      break;
    case (helics *)0x12:
      goto switchD_0037f97d_caseD_12;
    }
  case (helics *)0xc:
switchD_0037f97d_caseD_c:
    iVar4 = bcmp(__s1,"publications",(size_t)this);
    if (iVar4 == 0) {
      local_c8 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_c8;
      *(undefined2 *)&__return_storage_ptr__->field_2 = 0x5b;
      __return_storage_ptr__->_M_string_length = 1;
      pBVar11 = (hm->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_a0 = (hm->handles).
                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pBVar11 != local_a0) {
        pBVar12 = (hm->handles).
                  super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppBVar10 = (hm->handles).
                   super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        do {
          if ((((iVar5 == -2010000000) || (iVar5 == -1700000000)) ||
              ((pBVar11->handle).fed_id.gid == iVar5)) &&
             (((pBVar11->handleType | 4) == TRANSLATOR && ((pBVar11->key)._M_string_length != 0))))
          {
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            pcVar3 = (pBVar11->key)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c0,pcVar3,pcVar3 + (pBVar11->key)._M_string_length);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_90,&local_c0);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::dump(&local_f0,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_90,-1,' ',true,hex);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_90);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,
                      (char *)CONCAT71(local_f0._M_dataplus._M_p._1_7_,
                                       local_f0._M_dataplus._M_p._0_1_),local_f0._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_f0._M_dataplus._M_p._1_7_,local_f0._M_dataplus._M_p._0_1_) !=
                &local_f0.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_f0._M_dataplus._M_p._1_7_,
                                       local_f0._M_dataplus._M_p._0_1_),
                              local_f0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,',');
          }
          pBVar11 = pBVar11 + 1;
          if (pBVar11 == pBVar12) {
            pBVar11 = ppBVar10[1];
            ppBVar10 = ppBVar10 + 1;
            pBVar12 = pBVar11 + 3;
          }
        } while (pBVar11 != local_a0);
      }
      uVar7 = __return_storage_ptr__->_M_string_length;
      if (uVar7 < 2) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,']');
        return __return_storage_ptr__;
      }
      goto LAB_003805ed;
    }
    switch(this) {
    case (helics *)0x7:
      goto switchD_0037f97d_caseD_7;
    default:
      goto switchD_0037f97d_caseD_8;
    case (helics *)0x9:
      goto switchD_0037f97d_caseD_9;
    case (helics *)0xb:
      goto switchD_0037f97d_caseD_b;
    case (helics *)0xe:
      goto switchD_0037f97d_caseD_e;
    case (helics *)0x10:
      goto switchD_0037f97d_caseD_10;
    case (helics *)0x11:
      break;
    case (helics *)0x12:
      goto switchD_0037f97d_caseD_12;
    case (helics *)0x13:
      goto switchD_0037f97d_caseD_13;
    }
  case (helics *)0xd:
switchD_0037f97d_caseD_d:
    iVar4 = bcmp(__s1,"input_details",(size_t)this);
    if (iVar4 == 0) {
      local_f0._M_dataplus._M_p._0_1_ = 0;
      local_f0._M_string_length = 0;
      if (*(long *)(lVar9 + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(lVar9 + 0x18))(lVar9);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_40,(initializer_list_t)ZEXT816(0),false,array);
      pvVar6 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_f0,"inputs");
      vVar1 = (pvVar6->m_data).m_type;
      (pvVar6->m_data).m_type = local_40.m_type;
      jVar2 = (pvVar6->m_data).m_value;
      (pvVar6->m_data).m_value = local_40.m_value;
      local_40.m_type = vVar1;
      local_40.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_40);
      pBVar11 = (hm->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pBVar12 = (hm->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pBVar11 != pBVar12) {
        pBVar8 = (hm->handles).
                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppBVar10 = (hm->handles).
                   super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        do {
          if ((((local_cc.gid == -2010000000) || (local_cc.gid == -1700000000)) ||
              ((pBVar11->handle).fed_id.gid == local_cc.gid)) &&
             (((pBVar11->handleType == TRANSLATOR || (pBVar11->handleType == INPUT)) &&
              ((pBVar11->key)._M_string_length != 0)))) {
            storeInput(pBVar11,(json *)&local_f0,
                       local_cc.gid == -2010000000 || local_cc.gid == -1700000000);
          }
          pBVar11 = pBVar11 + 1;
          if (pBVar11 == pBVar8) {
            pBVar11 = ppBVar10[1];
            ppBVar10 = ppBVar10 + 1;
            pBVar8 = pBVar11 + 3;
          }
        } while (pBVar11 != pBVar12);
      }
      fileops::generateJsonString(__return_storage_ptr__,(json *)&local_f0,true);
      goto LAB_00380461;
    }
    switch(this) {
    case (helics *)0x7:
      goto switchD_0037f97d_caseD_7;
    default:
      goto switchD_0037f97d_caseD_8;
    case (helics *)0x9:
      goto switchD_0037f97d_caseD_9;
    case (helics *)0xb:
      goto switchD_0037f97d_caseD_b;
    case (helics *)0xc:
      goto switchD_0037f97d_caseD_c;
    case (helics *)0xe:
      goto switchD_0037f97d_caseD_e;
    case (helics *)0x10:
      goto switchD_0037f97d_caseD_10;
    case (helics *)0x11:
      break;
    case (helics *)0x12:
      goto switchD_0037f97d_caseD_12;
    case (helics *)0x13:
      goto switchD_0037f97d_caseD_13;
    }
  case (helics *)0xe:
switchD_0037f97d_caseD_e:
    iVar5 = bcmp(__s1,"filter_details",(size_t)this);
    if (iVar5 == 0) {
      local_f0._M_dataplus._M_p._0_1_ = 0;
      local_f0._M_string_length = 0;
      if (*(long *)(lVar9 + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(lVar9 + 0x18))(lVar9);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_60,(initializer_list_t)ZEXT816(0),false,array);
      pvVar6 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_f0,"filters");
      vVar1 = (pvVar6->m_data).m_type;
      (pvVar6->m_data).m_type = local_60.m_type;
      jVar2 = (pvVar6->m_data).m_value;
      (pvVar6->m_data).m_value = local_60.m_value;
      local_60.m_type = vVar1;
      local_60.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_60);
      pBVar11 = (hm->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pBVar12 = (hm->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pBVar11 != pBVar12) {
        pBVar8 = (hm->handles).
                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppBVar10 = (hm->handles).
                   super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        do {
          if ((((local_cc.gid == -2010000000) || (local_cc.gid == -1700000000)) ||
              ((pBVar11->handle).fed_id.gid == local_cc.gid)) &&
             ((pBVar11->handleType == FILTER && ((pBVar11->key)._M_string_length != 0)))) {
            storeFilter(pBVar11,(json *)&local_f0,
                        local_cc.gid == -2010000000 || local_cc.gid == -1700000000);
          }
          pBVar11 = pBVar11 + 1;
          if (pBVar11 == pBVar8) {
            pBVar11 = ppBVar10[1];
            ppBVar10 = ppBVar10 + 1;
            pBVar8 = pBVar11 + 3;
          }
        } while (pBVar11 != pBVar12);
      }
      fileops::generateJsonString(__return_storage_ptr__,(json *)&local_f0,true);
      goto LAB_00380461;
    }
    switch(this) {
    case (helics *)0x9:
      goto switchD_0037f97d_caseD_9;
    default:
      goto switchD_0037f97d_caseD_8;
    case (helics *)0xb:
      goto switchD_0037f97d_caseD_b;
    case (helics *)0x10:
      goto switchD_0037f97d_caseD_10;
    case (helics *)0x11:
      break;
    case (helics *)0x12:
      goto switchD_0037f97d_caseD_12;
    }
  case (helics *)0x10:
switchD_0037f97d_caseD_10:
    iVar5 = bcmp(__s1,"endpoint_details",(size_t)this);
    if (iVar5 == 0) {
      local_f0._M_dataplus._M_p._0_1_ = 0;
      local_f0._M_string_length = 0;
      if (*(long *)(lVar9 + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(lVar9 + 0x18))(lVar9);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_80,(initializer_list_t)ZEXT816(0),false,array);
      pvVar6 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_f0,"endpoints");
      vVar1 = (pvVar6->m_data).m_type;
      (pvVar6->m_data).m_type = local_80.m_type;
      jVar2 = (pvVar6->m_data).m_value;
      (pvVar6->m_data).m_value = local_80.m_value;
      local_80.m_type = vVar1;
      local_80.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_80);
      pBVar11 = (hm->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pBVar12 = (hm->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pBVar11 != pBVar12) {
        pBVar8 = (hm->handles).
                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppBVar10 = (hm->handles).
                   super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        do {
          if ((((local_cc.gid == -2010000000) || (local_cc.gid == -1700000000)) ||
              ((pBVar11->handle).fed_id.gid == local_cc.gid)) &&
             (((pBVar11->handleType == TRANSLATOR || (pBVar11->handleType == ENDPOINT)) &&
              ((pBVar11->key)._M_string_length != 0)))) {
            storeEndpoint(pBVar11,(json *)&local_f0,
                          local_cc.gid == -2010000000 || local_cc.gid == -1700000000);
          }
          pBVar11 = pBVar11 + 1;
          if (pBVar11 == pBVar8) {
            pBVar11 = ppBVar10[1];
            ppBVar10 = ppBVar10 + 1;
            pBVar8 = pBVar11 + 3;
          }
        } while (pBVar11 != pBVar12);
      }
      fileops::generateJsonString(__return_storage_ptr__,(json *)&local_f0,true);
      goto LAB_00380461;
    }
    if (this != (helics *)0x11) goto switchD_0037f97d_caseD_8;
    break;
  case (helics *)0x11:
    break;
  case (helics *)0x12:
switchD_0037f97d_caseD_12:
    iVar5 = bcmp(__s1,"translator_details",(size_t)this);
    if (iVar5 == 0) {
      local_f0._M_dataplus._M_p._0_1_ = 0;
      local_f0._M_string_length = 0;
      if (*(long *)(lVar9 + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(lVar9 + 0x18))(lVar9);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_70,(initializer_list_t)ZEXT816(0),false,array);
      pvVar6 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_f0,"translators");
      vVar1 = (pvVar6->m_data).m_type;
      (pvVar6->m_data).m_type = local_70.m_type;
      jVar2 = (pvVar6->m_data).m_value;
      (pvVar6->m_data).m_value = local_70.m_value;
      local_70.m_type = vVar1;
      local_70.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_70);
      pBVar11 = (hm->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pBVar12 = (hm->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pBVar11 != pBVar12) {
        pBVar8 = (hm->handles).
                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppBVar10 = (hm->handles).
                   super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        do {
          if ((((local_cc.gid == -2010000000) || (local_cc.gid == -1700000000)) ||
              ((pBVar11->handle).fed_id.gid == local_cc.gid)) &&
             ((pBVar11->handleType == TRANSLATOR && ((pBVar11->key)._M_string_length != 0)))) {
            storeTranslator(pBVar11,(json *)&local_f0,
                            local_cc.gid == -2010000000 || local_cc.gid == -1700000000);
          }
          pBVar11 = pBVar11 + 1;
          if (pBVar11 == pBVar8) {
            pBVar11 = ppBVar10[1];
            ppBVar10 = ppBVar10 + 1;
            pBVar8 = pBVar11 + 3;
          }
        } while (pBVar11 != pBVar12);
      }
      fileops::generateJsonString(__return_storage_ptr__,(json *)&local_f0,true);
      goto LAB_00380461;
    }
    if (this != (helics *)0x11) {
      if (this != (helics *)&DAT_00000010) {
        if (this != (helics *)0x9) goto switchD_0037f97d_caseD_8;
        goto switchD_0037f97d_caseD_9;
      }
      goto switchD_0037f97d_caseD_10;
    }
    break;
  case (helics *)0x13:
switchD_0037f97d_caseD_13:
    iVar4 = bcmp(__s1,"publication_details",(size_t)this);
    if (iVar4 == 0) {
      local_f0._M_dataplus._M_p._0_1_ = 0;
      local_f0._M_string_length = 0;
      if (*(long *)(lVar9 + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(lVar9 + 0x18))(lVar9);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_50,(initializer_list_t)ZEXT816(0),false,array);
      pvVar6 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_f0,"publications");
      vVar1 = (pvVar6->m_data).m_type;
      (pvVar6->m_data).m_type = local_50.m_type;
      jVar2 = (pvVar6->m_data).m_value;
      (pvVar6->m_data).m_value = local_50.m_value;
      local_50.m_type = vVar1;
      local_50.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_50);
      pBVar11 = (hm->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pBVar12 = (hm->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pBVar11 != pBVar12) {
        pBVar8 = (hm->handles).
                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppBVar10 = (hm->handles).
                   super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        do {
          if ((((local_cc.gid == -2010000000) || (local_cc.gid == -1700000000)) ||
              ((pBVar11->handle).fed_id.gid == local_cc.gid)) &&
             (((pBVar11->handleType | 4) == TRANSLATOR && ((pBVar11->key)._M_string_length != 0))))
          {
            storePublication(pBVar11,(json *)&local_f0,
                             local_cc.gid == -2010000000 || local_cc.gid == -1700000000);
          }
          pBVar11 = pBVar11 + 1;
          if (pBVar11 == pBVar8) {
            pBVar11 = ppBVar10[1];
            ppBVar10 = ppBVar10 + 1;
            pBVar8 = pBVar11 + 3;
          }
        } while (pBVar11 != pBVar12);
      }
      fileops::generateJsonString(__return_storage_ptr__,(json *)&local_f0,true);
      goto LAB_00380461;
    }
    switch(this) {
    case (helics *)0x7:
      goto switchD_0037f97d_caseD_7;
    default:
      goto switchD_0037f97d_caseD_8;
    case (helics *)0x9:
      goto switchD_0037f97d_caseD_9;
    case (helics *)0xb:
      goto switchD_0037f97d_caseD_b;
    case (helics *)0xe:
      goto switchD_0037f97d_caseD_e;
    case (helics *)0x10:
      goto switchD_0037f97d_caseD_10;
    case (helics *)0x11:
      break;
    case (helics *)0x12:
      goto switchD_0037f97d_caseD_12;
    }
  }
  iVar5 = bcmp(__s1,"interface_details",(size_t)this);
  if (iVar5 != 0) {
switchD_0037f97d_caseD_8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  jVar13 = generateInterfaceConfig_abi_cxx11_((helics *)&local_f0,hm,&local_cc);
  if (*(long *)(lVar9 + 0x10) == 0) {
    std::__throw_bad_function_call();
  }
  (**(code **)(lVar9 + 0x18))(lVar9,&local_f0,jVar13.m_data.m_value.object);
  fileops::generateJsonString(__return_storage_ptr__,(json *)&local_f0,true);
LAB_00380461:
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)&local_f0);
  return __return_storage_ptr__;
}

Assistant:

std::string generateInterfaceQueryResults(std::string_view request,
                                          const HandleManager& handles,
                                          const GlobalFederateId fed,
                                          const std::function<void(nlohmann::json&)>& addHeaderInfo)
{
    if (request == "inputs") {
        return generateStringVector_if(
            handles,
            [](auto& handle) { return handle.key; },
            [fed](auto& handle) {
                return ((!fed.isValid() || handle.handle.fed_id == fed) &&
                        (handle.handleType == InterfaceType::INPUT ||
                         handle.handleType == InterfaceType::TRANSLATOR) &&
                        !handle.key.empty());
            });
    }
    if (request == "input_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["inputs"] = nlohmann::json::array();
        for (const auto& handle : handles) {
            if ((!fed.isValid() || handle.handle.fed_id == fed) &&
                (handle.handleType == InterfaceType::INPUT ||
                 handle.handleType == InterfaceType::TRANSLATOR) &&
                !handle.key.empty()) {
                storeInput(handle, base, !fed.isValid());
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "publications") {
        return generateStringVector_if(
            handles,
            [](auto& handle) { return handle.key; },
            [fed](auto& handle) {
                return ((!fed.isValid() || handle.handle.fed_id == fed) &&
                        (handle.handleType == InterfaceType::PUBLICATION ||
                         handle.handleType == InterfaceType::TRANSLATOR) &&
                        !handle.key.empty());
            });
    }
    if (request == "publication_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["publications"] = nlohmann::json::array();
        for (const auto& handle : handles) {
            if ((!fed.isValid() || handle.handle.fed_id == fed) &&
                (handle.handleType == InterfaceType::PUBLICATION ||
                 handle.handleType == InterfaceType::TRANSLATOR) &&
                !handle.key.empty()) {
                storePublication(handle, base, !fed.isValid());
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "filters") {
        return generateStringVector_if(
            handles,
            [](auto& handle) { return handle.key; },
            [fed](auto& handle) {
                return ((!fed.isValid() || handle.handle.fed_id == fed) &&
                        handle.handleType == InterfaceType::FILTER && !handle.key.empty());
            });
    }
    if (request == "filter_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["filters"] = nlohmann::json::array();
        for (const auto& handle : handles) {
            if ((!fed.isValid() || handle.handle.fed_id == fed) &&
                handle.handleType == InterfaceType::FILTER && !handle.key.empty()) {
                storeFilter(handle, base, !fed.isValid());
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "translators") {
        return generateStringVector_if(
            handles,
            [](auto& handle) { return handle.key; },
            [fed](auto& handle) {
                return ((!fed.isValid() || handle.handle.fed_id == fed) &&
                        handle.handleType == InterfaceType::TRANSLATOR && !handle.key.empty());
            });
    }
    if (request == "translator_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["translators"] = nlohmann::json::array();
        for (const auto& handle : handles) {
            if ((!fed.isValid() || handle.handle.fed_id == fed) &&
                handle.handleType == InterfaceType::TRANSLATOR && !handle.key.empty()) {
                storeTranslator(handle, base, !fed.isValid());
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "endpoints") {
        return generateStringVector_if(
            handles,
            [](auto& handle) { return handle.key; },
            [fed](auto& handle) {
                return ((!fed.isValid() || handle.handle.fed_id == fed) &&
                        (handle.handleType == InterfaceType::ENDPOINT ||
                         handle.handleType == InterfaceType::TRANSLATOR) &&
                        !handle.key.empty());
            });
    }
    if (request == "endpoint_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["endpoints"] = nlohmann::json::array();
        for (const auto& handle : handles) {
            if ((!fed.isValid() || handle.handle.fed_id == fed) &&
                (handle.handleType == InterfaceType::ENDPOINT ||
                 handle.handleType == InterfaceType::TRANSLATOR) &&
                !handle.key.empty()) {
                storeEndpoint(handle, base, !fed.isValid());
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "interface_details") {
        nlohmann::json base = generateInterfaceConfig(handles, fed);
        addHeaderInfo(base);
        return fileops::generateJsonString(base);
    }

    return std::string{};
}